

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O3

int coda_data_dictionary_find_definition_for_product
              (coda_product *product,coda_product_definition **definition)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  coda_cursor_conflict cursor;
  coda_cursor_conflict local_320;
  
  iVar1 = coda_cursor_set_product(&local_320,product);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = coda_evaluate_detection_node
                      (*(coda_detection_node **)
                        (*(long *)(in_FS_OFFSET + -0x18) + 0x18 +
                        (ulong)(product->format + (uint)(product->format == coda_format_ascii)) * 8)
                       ,&local_320,definition);
  }
  return iVar2;
}

Assistant:

int coda_data_dictionary_find_definition_for_product(coda_product *product, coda_product_definition **definition)
{
    coda_cursor cursor;

    if (coda_cursor_set_product(&cursor, product) != 0)
    {
        return -1;
    }

    return coda_evaluate_detection_node(coda_data_dictionary_get_detection_tree(product->format), &cursor, definition);
}